

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

InstanceSymbol *
slang::ast::InstanceSymbol::createDefault
          (Compilation *comp,DefinitionSymbol *definition,
          HierarchyOverrideNode *hierarchyOverrideNode,ConfigBlockSymbol *configBlock,
          ConfigRule *configRule,SourceLocation locationOverride)

{
  bool bVar1;
  InstanceSymbol *pIVar2;
  ResolvedConfig *pRVar3;
  span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *psVar4;
  long in_RCX;
  ConfigBlockSymbol *in_RSI;
  InstanceSymbol *in_RDI;
  ConfigRule *in_R8;
  ResolvedConfig *rc;
  InstanceSymbol *result;
  SourceLocation loc;
  ConfigBlockSymbol *in_stack_00000178;
  HierarchyOverrideNode *in_stack_00000180;
  DefinitionSymbol *in_stack_00000188;
  Compilation *in_stack_00000190;
  bitmask<slang::ast::InstanceFlags> in_stack_0000019f;
  SourceLocation in_stack_000001a0;
  ConfigRule *in_stack_000001b0;
  InstanceSymbol *this;
  InstanceBodySymbol *args_2;
  SourceLocation *args_1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  BumpAllocator *in_stack_ffffffffffffffb0;
  SourceLocation local_8;
  
  bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0x39d995);
  if (bVar1) {
    args_1 = &local_8;
  }
  else {
    args_1 = &(in_RSI->super_Symbol).location;
  }
  args_2 = (InstanceBodySymbol *)&(in_RSI->super_Symbol).name;
  this = in_RDI;
  bitmask<slang::ast::InstanceFlags>::bitmask
            ((bitmask<slang::ast::InstanceFlags> *)&stack0xffffffffffffffb7,None);
  InstanceBodySymbol::fromDefinition
            (in_stack_00000190,in_stack_00000188,in_stack_000001a0,in_stack_0000019f,
             in_stack_00000180,in_stack_00000178,in_stack_000001b0);
  pIVar2 = BumpAllocator::
           emplace<slang::ast::InstanceSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation&,slang::ast::InstanceBodySymbol&>
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,args_1,args_2);
  if (in_RCX != 0) {
    pRVar3 = BumpAllocator::
             emplace<slang::ast::ResolvedConfig,slang::ast::ConfigBlockSymbol_const&,slang::ast::InstanceSymbol&>
                       ((BumpAllocator *)this,in_RSI,in_RDI);
    pRVar3->configRule = in_R8;
    if (in_R8 != (ConfigRule *)0x0) {
      in_R8->isUsed = true;
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                          *)0x39da99);
      if (bVar1) {
        psVar4 = std::
                 optional<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>::
                 operator*((optional<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                            *)0x39daa9);
        (pRVar3->liblist)._M_ptr = psVar4->_M_ptr;
        (pRVar3->liblist)._M_extent._M_extent_value = (psVar4->_M_extent)._M_extent_value;
      }
    }
    pIVar2->resolvedConfig = pRVar3;
  }
  return pIVar2;
}

Assistant:

InstanceSymbol& InstanceSymbol::createDefault(Compilation& comp, const DefinitionSymbol& definition,
                                              const HierarchyOverrideNode* hierarchyOverrideNode,
                                              const ConfigBlockSymbol* configBlock,
                                              const ConfigRule* configRule,
                                              SourceLocation locationOverride) {
    auto loc = locationOverride ? locationOverride : definition.location;
    auto& result = *comp.emplace<InstanceSymbol>(
        definition.name, loc,
        InstanceBodySymbol::fromDefinition(comp, definition, loc, InstanceFlags::None,
                                           hierarchyOverrideNode, configBlock, configRule));

    if (configBlock) {
        auto rc = comp.emplace<ResolvedConfig>(*configBlock, result);
        rc->configRule = configRule;

        if (configRule) {
            configRule->isUsed = true;
            if (configRule->liblist)
                rc->liblist = *configRule->liblist;
        }
        result.resolvedConfig = rc;
    }

    return result;
}